

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

int abon(void)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  
  bVar1 = acurr(0);
  bVar2 = acurr(3);
  if (u.umonnum == u.umonster) {
    iVar3 = -2;
    if (((('\x05' < (char)bVar1) && (iVar3 = -1, 7 < bVar1)) && (iVar3 = 0, 0x10 < bVar1)) &&
       (iVar3 = 1, 0x44 < bVar1)) {
      iVar3 = 3 - (uint)(bVar1 < 0x76);
    }
    iVar3 = (uint)(u.ulevel < 3) + iVar3;
    if ('\x03' < (char)bVar2) {
      if (bVar2 < 6) {
        return iVar3 + -2;
      }
      if (bVar2 < 8) {
        return iVar3 + -1;
      }
      if (bVar2 < 0xe) {
        return iVar3;
      }
      return iVar3 + (uint)(byte)(bVar2 - 0xe);
    }
  }
  else {
    iVar3 = adj_lev(&u.uz,mons + u.umonnum);
  }
  return iVar3 + -3;
}

Assistant:

int abon(void)
{
	int sbon;
	int str = ACURR(A_STR), dex = ACURR(A_DEX);

	if (Upolyd) return adj_lev(&u.uz, &mons[u.umonnum]) - 3;
	if (str < 6) sbon = -2;
	else if (str < 8) sbon = -1;
	else if (str < 17) sbon = 0;
	else if (str <= STR18(50)) sbon = 1;	/* up to 18/50 */
	else if (str < STR18(100)) sbon = 2;
	else sbon = 3;

/* Game tuning kludge: make it a bit easier for a low level character to hit */
	sbon += (u.ulevel < 3) ? 1 : 0;

	if (dex < 4) return sbon-3;
	else if (dex < 6) return sbon-2;
	else if (dex < 8) return sbon-1;
	else if (dex < 14) return sbon;
	else return sbon + dex-14;
}